

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_meta___call(lua_State *L)

{
  int iVar1;
  long *plVar2;
  GCcdata *pGVar3;
  CTState *cts_00;
  cTValue *tv_00;
  GCstr *pGVar4;
  lua_State *in_RDI;
  int ret;
  MMS mm;
  cTValue *tv;
  CType *ct;
  CTypeID id;
  GCcdata *cd;
  CTState *cts;
  CTState *cts_1;
  CType *ct_1;
  GCcdata *in_stack_00000120;
  lua_State *in_stack_00000128;
  GCstr *in_stack_00000168;
  CTypeID in_stack_00000174;
  lua_State *in_stack_00000178;
  int in_stack_ffffffffffffff3c;
  lua_State *in_stack_ffffffffffffff40;
  int local_b4;
  undefined8 in_stack_ffffffffffffff50;
  uint local_9c;
  int local_7c;
  
  plVar2 = (long *)(ulong)*(uint *)((ulong)(in_RDI->glref).ptr32 + 0x194);
  plVar2[2] = (long)in_RDI;
  pGVar3 = ffi_checkcdata(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  local_9c = (uint)pGVar3->ctypeid;
  local_b4 = 9;
  if (pGVar3->ctypeid == 0x15) {
    local_9c = pGVar3[1].nextgc.gcptr32;
    local_b4 = 0x13;
  }
  else {
    iVar1 = lj_ccall_func(in_stack_00000128,in_stack_00000120);
    if (-1 < iVar1) {
      return iVar1;
    }
  }
  for (cts_00 = (CTState *)(*plVar2 + (ulong)local_9c * 0x10); *(uint *)&cts_00->tab >> 0x1c == 8;
      cts_00 = (CTState *)(*plVar2 + (ulong)(*(uint *)&cts_00->tab & 0xffff) * 0x10)) {
  }
  tv_00 = lj_ctype_meta(cts_00,(CTypeID)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                        (MMS)in_stack_ffffffffffffff50);
  if (tv_00 == (cTValue *)0x0) {
    if (local_b4 == 9) {
      pGVar4 = lj_ctype_repr(in_stack_00000178,in_stack_00000174,in_stack_00000168);
      lj_err_callerv(in_RDI,LJ_ERR_FFI_BADCALL,pGVar4 + 1);
    }
    local_7c = lj_cf_ffi_new((lua_State *)cts_00);
  }
  else {
    local_7c = lj_meta_tailcall(in_RDI,tv_00);
  }
  return local_7c;
}

Assistant:

LJLIB_CF(ffi_meta___call)	LJLIB_REC(cdata_call)
{
  CTState *cts = ctype_cts(L);
  GCcdata *cd = ffi_checkcdata(L, 1);
  CTypeID id = cd->ctypeid;
  CType *ct;
  cTValue *tv;
  MMS mm = MM_call;
  if (cd->ctypeid == CTID_CTYPEID) {
    id = *(CTypeID *)cdataptr(cd);
    mm = MM_new;
  } else {
    int ret = lj_ccall_func(L, cd);
    if (ret >= 0)
      return ret;
  }
  /* Handle ctype __call/__new metamethod. */
  ct = ctype_raw(cts, id);
  if (ctype_isptr(ct->info)) id = ctype_cid(ct->info);
  tv = lj_ctype_meta(cts, id, mm);
  if (tv)
    return lj_meta_tailcall(L, tv);
  else if (mm == MM_call)
    lj_err_callerv(L, LJ_ERR_FFI_BADCALL, strdata(lj_ctype_repr(L, id, NULL)));
  return lj_cf_ffi_new(L);
}